

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_bicubic.h
# Opt level: O0

void ncnn::resize_bicubic_image(Mat *src,Mat *dst,float *alpha,int *xofs,float *beta,int *yofs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  float *pfVar39;
  float *pfVar40;
  float *pfVar41;
  float *pfVar42;
  float *pfVar43;
  float *pfVar44;
  long in_RCX;
  float *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float *in_R8;
  long in_R9;
  float fVar45;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  __m128 _D_1;
  __m128 _rows3_1;
  __m128 _rows2_1;
  __m128 _rows1_1;
  __m128 _rows0_1;
  __m128 _b3_128;
  __m128 _b2_128;
  __m128 _b1_128;
  __m128 _b0_128;
  __m256 _D;
  __m256 _rows3;
  __m256 _rows2;
  __m256 _rows1;
  __m256 _rows0;
  __m256 _b3_256;
  __m256 _b2_256;
  __m256 _b1_256;
  __m256 _b0_256;
  int dx;
  float *Dp;
  float *rows3p;
  float *rows2p;
  float *rows1p;
  float *rows0p;
  float b3;
  float b2;
  float b1;
  float b0;
  float a3_3;
  float a2_3;
  float a1_3;
  float a0_3;
  float *S3p_3;
  float *S2p_2;
  float *S1p_1;
  float *S0p;
  int sx_3;
  int dx_4;
  float *rows3p_4;
  float *rows2p_3;
  float *rows1p_2;
  float *rows0p_1;
  float *alphap_3;
  float *S3_3;
  float *S2_2;
  float *S1_1;
  float *S0;
  float a3_2;
  float a2_2;
  float a1_2;
  float a0_2;
  float *S3p_2;
  float *S2p_1;
  float *S1p;
  int sx_2;
  int dx_3;
  float *rows3p_3;
  float *rows2p_2;
  float *rows1p_1;
  float *alphap_2;
  float *S3_2;
  float *S2_1;
  float *S1;
  float *rows2_old;
  float *rows1_old_1;
  float *rows0_old_2;
  float a3_1;
  float a2_1;
  float a1_1;
  float a0_1;
  float *S3p_1;
  float *S2p;
  int sx_1;
  int dx_2;
  float *rows3p_2;
  float *rows2p_1;
  float *alphap_1;
  float *S3_1;
  float *S2;
  float *rows1_old;
  float *rows0_old_1;
  float a3;
  float a2;
  float a1;
  float a0;
  float *S3p;
  int sx;
  int dx_1;
  float *rows3p_1;
  float *alphap;
  float *S3;
  float *rows0_old;
  int sy;
  int dy;
  int prev_sy1;
  float *rows3;
  float *rows2;
  float *rows1;
  float *rows0;
  Mat rowsbuf3;
  Mat rowsbuf2;
  Mat rowsbuf1;
  Mat rowsbuf0;
  int h;
  int w;
  Allocator *in_stack_ffffffffffffefb0;
  size_t in_stack_ffffffffffffefb8;
  int in_stack_ffffffffffffefc4;
  Mat *in_stack_ffffffffffffefc8;
  undefined8 local_e50;
  undefined8 uStack_e48;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  int local_c94;
  float *local_c90;
  float *local_c88;
  float *local_c80;
  float *local_c78;
  float *local_c70;
  int local_c24;
  float *local_c00;
  int local_bac;
  float *local_b90;
  int local_b34;
  float *local_b20;
  int local_adc;
  float *local_ad0;
  int local_ab0;
  int local_aac;
  float *local_aa8;
  float *local_aa0;
  float *local_a98;
  float *local_a90;
  float *local_a88;
  int *local_a80;
  undefined8 local_a78;
  undefined4 local_a70;
  long *local_a68;
  undefined4 local_a60;
  undefined4 local_a5c;
  undefined4 local_a58;
  undefined4 local_a54;
  undefined4 local_a50;
  undefined8 local_a48;
  float *local_a40;
  int *local_a38;
  undefined8 local_a30;
  undefined4 local_a28;
  long *local_a20;
  undefined4 local_a18;
  undefined4 local_a14;
  undefined4 local_a10;
  undefined4 local_a0c;
  undefined4 local_a08;
  undefined8 local_a00;
  float *local_9e8;
  int *local_9e0;
  undefined8 local_9d8;
  undefined4 local_9d0;
  long *local_9c8;
  undefined4 local_9c0;
  undefined4 local_9bc;
  undefined4 local_9b8;
  undefined4 local_9b4;
  undefined4 local_9b0;
  undefined8 local_9a8;
  float *local_9a0;
  int *local_998;
  undefined8 local_990;
  undefined4 local_988;
  long *local_980;
  undefined4 local_978;
  undefined4 local_974;
  undefined4 local_970;
  undefined4 local_96c;
  undefined4 local_968;
  undefined8 local_960;
  int local_958;
  int local_954;
  long local_950;
  float *local_948;
  long local_940;
  float *local_938;
  long *local_930;
  long *local_928;
  float **local_920;
  float **local_910;
  float **local_900;
  float **local_8f0;
  int local_8dc;
  long *local_8d8;
  int local_8cc;
  long *local_8c8;
  int local_8bc;
  long *local_8b8;
  int local_8ac;
  long *local_8a8;
  int local_89c;
  long *local_898;
  int local_88c;
  long *local_888;
  int local_87c;
  long *local_878;
  int local_86c;
  long *local_868;
  int local_85c;
  long *local_858;
  int local_84c;
  long *local_848;
  int local_83c;
  long *local_838;
  float local_830;
  float local_82c;
  float local_828;
  float local_824;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  float local_760;
  float fStack_75c;
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  float local_5d4;
  float local_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  float local_5b4;
  float local_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  float local_594;
  float local_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float local_574;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  float *local_428;
  int local_410;
  undefined4 local_40c;
  float **local_408;
  int local_3f0;
  undefined4 local_3ec;
  float **local_3e8;
  int local_3d0;
  undefined4 local_3cc;
  float **local_3c8;
  int local_3b0;
  undefined4 local_3ac;
  float **local_3a8;
  float *local_3a0;
  float *local_390;
  float *local_380;
  float *local_370;
  undefined8 local_360;
  undefined8 uStack_358;
  float *local_348;
  undefined1 local_340 [32];
  float local_320;
  float local_31c;
  float local_318;
  float local_314;
  float local_310;
  float local_30c;
  float local_308;
  float local_304;
  undefined1 local_300 [32];
  float local_2e0;
  float local_2dc;
  float local_2d8;
  float local_2d4;
  float local_2d0;
  float local_2cc;
  float local_2c8;
  float local_2c4;
  undefined1 local_2c0 [32];
  float local_2a0;
  float local_29c;
  float local_298;
  float local_294;
  float local_290;
  float local_28c;
  float local_288;
  float local_284;
  undefined1 local_280 [32];
  float local_260;
  float local_25c;
  float local_258;
  float local_254;
  float local_250;
  float local_24c;
  float local_248;
  float local_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_170;
  undefined8 uStack_168;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  undefined8 local_150;
  undefined8 uStack_148;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  undefined8 local_130;
  undefined8 uStack_128;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float **local_110;
  float **local_108;
  float **local_100;
  float **local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  int local_dc;
  float **local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  int local_bc;
  float **local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  int local_9c;
  float **local_98;
  undefined8 local_90;
  undefined8 local_88;
  int local_7c;
  float **local_78;
  float *local_70;
  float *local_68;
  float *local_60;
  float *local_58;
  float *local_50;
  float *local_48;
  float *local_40;
  float *local_38;
  
  local_954 = *(int *)((long)in_RSI + 0x2c);
  local_958 = (int)in_RSI[6];
  local_d8 = &local_9a0;
  local_e8 = 4;
  local_f0 = 0;
  local_9a0 = (float *)0x0;
  local_998 = (int *)0x0;
  local_990 = 0;
  local_988 = 0;
  local_980 = (long *)0x0;
  local_978 = 0;
  local_974 = 0;
  local_970 = 0;
  local_96c = 0;
  local_968 = 0;
  local_960 = 0;
  local_950 = in_R9;
  local_948 = in_R8;
  local_940 = in_RCX;
  local_938 = in_RDX;
  local_930 = in_RSI;
  local_928 = in_RDI;
  local_dc = local_954;
  Mat::create(in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc4,in_stack_ffffffffffffefb8,
              in_stack_ffffffffffffefb0);
  local_b8 = &local_9e8;
  local_bc = local_954;
  local_c8 = 4;
  local_d0 = 0;
  local_9e8 = (float *)0x0;
  local_9e0 = (int *)0x0;
  local_9d8 = 0;
  local_9d0 = 0;
  local_9c8 = (long *)0x0;
  local_9c0 = 0;
  local_9bc = 0;
  local_9b8 = 0;
  local_9b4 = 0;
  local_9b0 = 0;
  local_9a8 = 0;
  Mat::create(in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc4,in_stack_ffffffffffffefb8,
              in_stack_ffffffffffffefb0);
  local_98 = &local_a40;
  local_9c = local_954;
  local_a8 = 4;
  local_b0 = 0;
  local_a40 = (float *)0x0;
  local_a38 = (int *)0x0;
  local_a30 = 0;
  local_a28 = 0;
  local_a20 = (long *)0x0;
  local_a18 = 0;
  local_a14 = 0;
  local_a10 = 0;
  local_a0c = 0;
  local_a08 = 0;
  local_a00 = 0;
  Mat::create(in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc4,in_stack_ffffffffffffefb8,
              in_stack_ffffffffffffefb0);
  local_78 = &local_a88;
  local_7c = local_954;
  local_88 = 4;
  local_90 = 0;
  local_a88 = (float *)0x0;
  local_a80 = (int *)0x0;
  local_a78 = 0;
  local_a70 = 0;
  local_a68 = (long *)0x0;
  local_a60 = 0;
  local_a5c = 0;
  local_a58 = 0;
  local_a54 = 0;
  local_a50 = 0;
  local_a48 = 0;
  Mat::create(in_stack_ffffffffffffefc8,in_stack_ffffffffffffefc4,in_stack_ffffffffffffefb8,
              in_stack_ffffffffffffefb0);
  local_f8 = &local_9a0;
  local_a90 = local_9a0;
  local_100 = &local_9e8;
  local_a98 = local_9e8;
  local_108 = &local_a40;
  local_aa0 = local_a40;
  local_110 = &local_a88;
  local_aa8 = local_a88;
  local_aac = -3;
  for (local_ab0 = 0; pfVar44 = local_a90, pfVar43 = local_a98, pfVar39 = local_aa0,
      local_ab0 < local_958; local_ab0 = local_ab0 + 1) {
    iVar1 = *(int *)(local_950 + (long)local_ab0 * 4);
    if (iVar1 != local_aac) {
      if (iVar1 == local_aac + 1) {
        local_a90 = local_a98;
        local_a98 = local_aa0;
        local_aa0 = local_aa8;
        local_aa8 = pfVar44;
        local_84c = iVar1 + 2;
        local_848 = local_928;
        lVar7 = *local_928;
        iVar2 = *(int *)((long)local_928 + 0x2c);
        lVar8 = local_928[2];
        local_ad0 = local_938;
        for (local_adc = 0; local_adc < local_954; local_adc = local_adc + 1) {
          pfVar39 = (float *)(lVar7 + (long)iVar2 * (long)local_84c * lVar8 +
                             (long)*(int *)(local_940 + (long)local_adc * 4) * 4);
          pfVar44[local_adc] =
               pfVar39[-1] * *local_ad0 + *pfVar39 * local_ad0[1] + pfVar39[1] * local_ad0[2] +
               pfVar39[2] * local_ad0[3];
          local_ad0 = local_ad0 + 4;
        }
      }
      else if (iVar1 == local_aac + 2) {
        local_a90 = local_aa0;
        local_a98 = local_aa8;
        local_aa0 = pfVar44;
        local_aa8 = pfVar43;
        local_85c = iVar1 + 1;
        local_858 = local_928;
        lVar7 = *local_928;
        iVar2 = *(int *)((long)local_928 + 0x2c);
        lVar8 = local_928[2];
        local_86c = iVar1 + 2;
        local_868 = local_928;
        lVar9 = *local_928;
        iVar3 = *(int *)((long)local_928 + 0x2c);
        lVar10 = local_928[2];
        local_b20 = local_938;
        for (local_b34 = 0; local_b34 < local_954; local_b34 = local_b34 + 1) {
          iVar4 = *(int *)(local_940 + (long)local_b34 * 4);
          pfVar39 = (float *)(lVar7 + (long)iVar2 * (long)local_85c * lVar8 + (long)iVar4 * 4);
          pfVar40 = (float *)(lVar9 + (long)iVar3 * (long)local_86c * lVar10 + (long)iVar4 * 4);
          fVar45 = *local_b20;
          fVar50 = local_b20[1];
          fVar51 = local_b20[2];
          fVar52 = local_b20[3];
          pfVar44[local_b34] =
               pfVar39[-1] * fVar45 + *pfVar39 * fVar50 + pfVar39[1] * fVar51 + pfVar39[2] * fVar52;
          pfVar43[local_b34] =
               pfVar40[-1] * fVar45 + *pfVar40 * fVar50 + pfVar40[1] * fVar51 + pfVar40[2] * fVar52;
          local_b20 = local_b20 + 4;
        }
      }
      else if (iVar1 == local_aac + 3) {
        local_a90 = local_aa8;
        local_a98 = pfVar44;
        local_aa0 = pfVar43;
        local_aa8 = pfVar39;
        local_878 = local_928;
        lVar7 = *local_928;
        iVar2 = *(int *)((long)local_928 + 0x2c);
        lVar8 = local_928[2];
        local_88c = iVar1 + 1;
        local_888 = local_928;
        lVar9 = *local_928;
        iVar3 = *(int *)((long)local_928 + 0x2c);
        lVar10 = local_928[2];
        local_89c = iVar1 + 2;
        local_898 = local_928;
        lVar11 = *local_928;
        iVar4 = *(int *)((long)local_928 + 0x2c);
        lVar12 = local_928[2];
        local_b90 = local_938;
        for (local_bac = 0; local_87c = iVar1, local_bac < local_954; local_bac = local_bac + 1) {
          iVar5 = *(int *)(local_940 + (long)local_bac * 4);
          pfVar40 = (float *)(lVar7 + (long)iVar2 * (long)iVar1 * lVar8 + (long)iVar5 * 4);
          pfVar41 = (float *)(lVar9 + (long)iVar3 * (long)local_88c * lVar10 + (long)iVar5 * 4);
          pfVar42 = (float *)(lVar11 + (long)iVar4 * (long)local_89c * lVar12 + (long)iVar5 * 4);
          fVar45 = *local_b90;
          fVar50 = local_b90[1];
          fVar51 = local_b90[2];
          fVar52 = local_b90[3];
          pfVar44[local_bac] =
               pfVar40[-1] * fVar45 + *pfVar40 * fVar50 + pfVar40[1] * fVar51 + pfVar40[2] * fVar52;
          pfVar43[local_bac] =
               pfVar41[-1] * fVar45 + *pfVar41 * fVar50 + pfVar41[1] * fVar51 + pfVar41[2] * fVar52;
          pfVar39[local_bac] =
               pfVar42[-1] * fVar45 + *pfVar42 * fVar50 + pfVar42[1] * fVar51 + pfVar42[2] * fVar52;
          local_b90 = local_b90 + 4;
        }
      }
      else {
        local_8ac = iVar1 + -1;
        local_8a8 = local_928;
        lVar7 = *local_928;
        iVar2 = *(int *)((long)local_928 + 0x2c);
        lVar8 = local_928[2];
        local_8b8 = local_928;
        lVar9 = *local_928;
        iVar3 = *(int *)((long)local_928 + 0x2c);
        lVar10 = local_928[2];
        local_8cc = iVar1 + 1;
        local_8c8 = local_928;
        lVar11 = *local_928;
        iVar4 = *(int *)((long)local_928 + 0x2c);
        lVar12 = local_928[2];
        local_8dc = iVar1 + 2;
        local_8d8 = local_928;
        lVar13 = *local_928;
        iVar5 = *(int *)((long)local_928 + 0x2c);
        lVar14 = local_928[2];
        local_c00 = local_938;
        for (local_c24 = 0; local_8bc = iVar1, local_c24 < local_954; local_c24 = local_c24 + 1) {
          iVar6 = *(int *)(local_940 + (long)local_c24 * 4);
          pfVar39 = (float *)(lVar7 + (long)iVar2 * (long)local_8ac * lVar8 + (long)iVar6 * 4);
          pfVar43 = (float *)(lVar9 + (long)iVar3 * (long)iVar1 * lVar10 + (long)iVar6 * 4);
          pfVar44 = (float *)(lVar11 + (long)iVar4 * (long)local_8cc * lVar12 + (long)iVar6 * 4);
          pfVar40 = (float *)(lVar13 + (long)iVar5 * (long)local_8dc * lVar14 + (long)iVar6 * 4);
          fVar45 = *local_c00;
          fVar50 = local_c00[1];
          fVar51 = local_c00[2];
          fVar52 = local_c00[3];
          local_a90[local_c24] =
               pfVar39[-1] * fVar45 + *pfVar39 * fVar50 + pfVar39[1] * fVar51 + pfVar39[2] * fVar52;
          local_a98[local_c24] =
               pfVar43[-1] * fVar45 + *pfVar43 * fVar50 + pfVar43[1] * fVar51 + pfVar43[2] * fVar52;
          local_aa0[local_c24] =
               pfVar44[-1] * fVar45 + *pfVar44 * fVar50 + pfVar44[1] * fVar51 + pfVar44[2] * fVar52;
          local_aa8[local_c24] =
               pfVar40[-1] * fVar45 + *pfVar40 * fVar50 + pfVar40[1] * fVar51 + pfVar40[2] * fVar52;
          local_c00 = local_c00 + 4;
        }
      }
    }
    local_824 = *local_948;
    local_828 = local_948[1];
    local_82c = local_948[2];
    local_830 = local_948[3];
    local_c70 = local_a90;
    local_c78 = local_a98;
    local_c80 = local_aa0;
    local_c88 = local_aa8;
    local_838 = local_930;
    local_83c = local_ab0;
    local_c90 = (float *)(*local_930 +
                         (long)*(int *)((long)local_930 + 0x2c) * (long)local_ab0 * local_930[2]);
    local_c94 = 0;
    auVar15 = vinsertps_avx(ZEXT416((uint)local_824),ZEXT416((uint)local_824),0x10);
    auVar15 = vinsertps_avx(auVar15,ZEXT416((uint)local_824),0x20);
    auVar15 = vinsertps_avx(auVar15,ZEXT416((uint)local_824),0x30);
    auVar16 = vinsertps_avx(ZEXT416((uint)local_824),ZEXT416((uint)local_824),0x10);
    auVar16 = vinsertps_avx(auVar16,ZEXT416((uint)local_824),0x20);
    auVar16 = vinsertps_avx(auVar16,ZEXT416((uint)local_824),0x30);
    auVar46._16_16_ = auVar15;
    auVar46._0_16_ = auVar16;
    local_340._0_8_ = auVar16._0_8_;
    local_340._8_8_ = auVar16._8_8_;
    local_340._16_8_ = auVar15._0_8_;
    local_340._24_8_ = auVar15._8_8_;
    auVar17 = vinsertps_avx(ZEXT416((uint)local_828),ZEXT416((uint)local_828),0x10);
    auVar17 = vinsertps_avx(auVar17,ZEXT416((uint)local_828),0x20);
    auVar17 = vinsertps_avx(auVar17,ZEXT416((uint)local_828),0x30);
    auVar18 = vinsertps_avx(ZEXT416((uint)local_828),ZEXT416((uint)local_828),0x10);
    auVar18 = vinsertps_avx(auVar18,ZEXT416((uint)local_828),0x20);
    auVar18 = vinsertps_avx(auVar18,ZEXT416((uint)local_828),0x30);
    auVar47._16_16_ = auVar17;
    auVar47._0_16_ = auVar18;
    local_300._0_8_ = auVar18._0_8_;
    local_300._8_8_ = auVar18._8_8_;
    local_300._16_8_ = auVar17._0_8_;
    local_300._24_8_ = auVar17._8_8_;
    auVar19 = vinsertps_avx(ZEXT416((uint)local_82c),ZEXT416((uint)local_82c),0x10);
    auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)local_82c),0x20);
    auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)local_82c),0x30);
    auVar20 = vinsertps_avx(ZEXT416((uint)local_82c),ZEXT416((uint)local_82c),0x10);
    auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)local_82c),0x20);
    auVar20 = vinsertps_avx(auVar20,ZEXT416((uint)local_82c),0x30);
    auVar48._16_16_ = auVar19;
    auVar48._0_16_ = auVar20;
    local_2c0._0_8_ = auVar20._0_8_;
    local_2c0._8_8_ = auVar20._8_8_;
    local_2c0._16_8_ = auVar19._0_8_;
    local_2c0._24_8_ = auVar19._8_8_;
    auVar21 = vinsertps_avx(ZEXT416((uint)local_830),ZEXT416((uint)local_830),0x10);
    auVar21 = vinsertps_avx(auVar21,ZEXT416((uint)local_830),0x20);
    auVar21 = vinsertps_avx(auVar21,ZEXT416((uint)local_830),0x30);
    auVar22 = vinsertps_avx(ZEXT416((uint)local_830),ZEXT416((uint)local_830),0x10);
    auVar22 = vinsertps_avx(auVar22,ZEXT416((uint)local_830),0x20);
    auVar22 = vinsertps_avx(auVar22,ZEXT416((uint)local_830),0x30);
    auVar49._16_16_ = auVar21;
    auVar49._0_16_ = auVar22;
    local_280._0_8_ = auVar22._0_8_;
    local_280._8_8_ = auVar22._8_8_;
    local_280._16_8_ = auVar21._0_8_;
    local_280._24_8_ = auVar21._8_8_;
    for (; local_c94 + 7 < local_954; local_c94 = local_c94 + 8) {
      local_58 = local_c70;
      uVar23 = *(undefined8 *)local_c70;
      uVar24 = *(undefined8 *)(local_c70 + 2);
      uVar25 = *(undefined8 *)(local_c70 + 4);
      uVar26 = *(undefined8 *)(local_c70 + 6);
      local_60 = local_c78;
      uVar27 = *(undefined8 *)local_c78;
      uVar28 = *(undefined8 *)(local_c78 + 2);
      uVar29 = *(undefined8 *)(local_c78 + 4);
      uVar30 = *(undefined8 *)(local_c78 + 6);
      local_68 = local_c80;
      uVar31 = *(undefined8 *)local_c80;
      uVar32 = *(undefined8 *)(local_c80 + 2);
      uVar33 = *(undefined8 *)(local_c80 + 4);
      uVar34 = *(undefined8 *)(local_c80 + 6);
      local_70 = local_c88;
      uVar35 = *(undefined8 *)local_c88;
      uVar36 = *(undefined8 *)(local_c88 + 2);
      uVar37 = *(undefined8 *)(local_c88 + 4);
      uVar38 = *(undefined8 *)(local_c88 + 6);
      local_800._0_4_ = (float)uVar23;
      local_800._4_4_ = (float)((ulong)uVar23 >> 0x20);
      uStack_7f8._0_4_ = (float)uVar24;
      uStack_7f8._4_4_ = (float)((ulong)uVar24 >> 0x20);
      uStack_7f0._0_4_ = (float)uVar25;
      uStack_7f0._4_4_ = (float)((ulong)uVar25 >> 0x20);
      uStack_7e8._0_4_ = (float)uVar26;
      uStack_7e8._4_4_ = (float)((ulong)uVar26 >> 0x20);
      local_820._0_4_ = auVar16._0_4_;
      local_820._4_4_ = auVar16._4_4_;
      uStack_818._0_4_ = auVar16._8_4_;
      uStack_818._4_4_ = auVar16._12_4_;
      uStack_810._0_4_ = auVar15._0_4_;
      uStack_810._4_4_ = auVar15._4_4_;
      uStack_808._0_4_ = auVar15._8_4_;
      local_dc0 = CONCAT44(local_800._4_4_ * local_820._4_4_,(float)local_800 * (float)local_820);
      uStack_db8 = CONCAT44(uStack_7f8._4_4_ * uStack_818._4_4_,
                            (float)uStack_7f8 * (float)uStack_818);
      uStack_db0 = CONCAT44(uStack_7f0._4_4_ * uStack_810._4_4_,
                            (float)uStack_7f0 * (float)uStack_810);
      uStack_da8 = CONCAT44(uStack_7e8._4_4_,(float)uStack_7e8 * (float)uStack_808);
      local_680 = local_300._0_8_;
      uStack_678 = local_300._8_8_;
      uStack_670 = local_300._16_8_;
      uStack_668 = local_300._24_8_;
      local_6a0 = local_dc0;
      uStack_698 = uStack_db8;
      uStack_690 = uStack_db0;
      uStack_688 = uStack_da8;
      local_660._0_4_ = (float)uVar27;
      local_620 = (float)local_660;
      local_660._4_4_ = (float)((ulong)uVar27 >> 0x20);
      fStack_61c = local_660._4_4_;
      uStack_658._0_4_ = (float)uVar28;
      fStack_618 = (float)uStack_658;
      uStack_658._4_4_ = (float)((ulong)uVar28 >> 0x20);
      fStack_614 = uStack_658._4_4_;
      uStack_650._0_4_ = (float)uVar29;
      fStack_610 = (float)uStack_650;
      uStack_650._4_4_ = (float)((ulong)uVar29 >> 0x20);
      fStack_60c = uStack_650._4_4_;
      uStack_648._0_4_ = (float)uVar30;
      fStack_608 = (float)uStack_648;
      uStack_648._4_4_ = (float)((ulong)uVar30 >> 0x20);
      fStack_604 = uStack_648._4_4_;
      local_640._0_4_ = auVar18._0_4_;
      local_640._4_4_ = auVar18._4_4_;
      uStack_638._0_4_ = auVar18._8_4_;
      uStack_638._4_4_ = auVar18._12_4_;
      uStack_630._0_4_ = auVar17._0_4_;
      uStack_630._4_4_ = auVar17._4_4_;
      uStack_628._0_4_ = auVar17._8_4_;
      local_220 = (float)local_660 * (float)local_640;
      fStack_21c = local_660._4_4_ * local_640._4_4_;
      fStack_218 = (float)uStack_658 * (float)uStack_638;
      fStack_214 = uStack_658._4_4_ * uStack_638._4_4_;
      fStack_210 = (float)uStack_650 * (float)uStack_630;
      fStack_20c = uStack_650._4_4_ * uStack_630._4_4_;
      fStack_208 = (float)uStack_648 * (float)uStack_628;
      local_240 = local_dc0;
      uStack_238 = uStack_db8;
      uStack_230 = uStack_db0;
      uStack_228 = uStack_da8;
      fVar45 = local_220 + (float)local_800 * (float)local_820;
      fVar50 = fStack_21c + local_800._4_4_ * local_820._4_4_;
      fVar51 = fStack_218 + (float)uStack_7f8 * (float)uStack_818;
      fVar52 = fStack_214 + uStack_7f8._4_4_ * uStack_818._4_4_;
      fVar53 = fStack_210 + (float)uStack_7f0 * (float)uStack_810;
      fVar54 = fStack_20c + uStack_7f0._4_4_ * uStack_810._4_4_;
      fVar55 = fStack_208 + (float)uStack_7e8 * (float)uStack_808;
      local_740 = CONCAT44(fVar50,fVar45);
      uStack_738 = CONCAT44(fVar52,fVar51);
      uStack_730 = CONCAT44(fVar54,fVar53);
      uStack_728 = CONCAT44(uStack_648._4_4_ + uStack_7e8._4_4_,fVar55);
      local_720 = local_2c0._0_8_;
      uStack_718 = local_2c0._8_8_;
      uStack_710 = local_2c0._16_8_;
      uStack_708 = local_2c0._24_8_;
      local_700._0_4_ = (float)uVar31;
      local_6c0 = (float)local_700;
      local_700._4_4_ = (float)((ulong)uVar31 >> 0x20);
      fStack_6bc = local_700._4_4_;
      uStack_6f8._0_4_ = (float)uVar32;
      fStack_6b8 = (float)uStack_6f8;
      uStack_6f8._4_4_ = (float)((ulong)uVar32 >> 0x20);
      fStack_6b4 = uStack_6f8._4_4_;
      uStack_6f0._0_4_ = (float)uVar33;
      fStack_6b0 = (float)uStack_6f0;
      uStack_6f0._4_4_ = (float)((ulong)uVar33 >> 0x20);
      fStack_6ac = uStack_6f0._4_4_;
      uStack_6e8._0_4_ = (float)uVar34;
      fStack_6a8 = (float)uStack_6e8;
      uStack_6e8._4_4_ = (float)((ulong)uVar34 >> 0x20);
      fStack_6a4 = uStack_6e8._4_4_;
      local_6e0._0_4_ = auVar20._0_4_;
      local_6e0._4_4_ = auVar20._4_4_;
      uStack_6d8._0_4_ = auVar20._8_4_;
      uStack_6d8._4_4_ = auVar20._12_4_;
      uStack_6d0._0_4_ = auVar19._0_4_;
      uStack_6d0._4_4_ = auVar19._4_4_;
      uStack_6c8._0_4_ = auVar19._8_4_;
      local_1e0 = (float)local_700 * (float)local_6e0;
      fStack_1dc = local_700._4_4_ * local_6e0._4_4_;
      fStack_1d8 = (float)uStack_6f8 * (float)uStack_6d8;
      fStack_1d4 = uStack_6f8._4_4_ * uStack_6d8._4_4_;
      fStack_1d0 = (float)uStack_6f0 * (float)uStack_6d0;
      fStack_1cc = uStack_6f0._4_4_ * uStack_6d0._4_4_;
      fStack_1c8 = (float)uStack_6e8 * (float)uStack_6c8;
      fVar45 = local_1e0 + fVar45;
      fVar50 = fStack_1dc + fVar50;
      fVar51 = fStack_1d8 + fVar51;
      fVar52 = fStack_1d4 + fVar52;
      fVar53 = fStack_1d0 + fVar53;
      fVar54 = fStack_1cc + fVar54;
      fVar55 = fStack_1c8 + fVar55;
      uStack_6e8._4_4_ = uStack_6e8._4_4_ + uStack_648._4_4_ + uStack_7e8._4_4_;
      local_7e0 = CONCAT44(fVar50,fVar45);
      uStack_7d8 = CONCAT44(fVar52,fVar51);
      uStack_7d0 = CONCAT44(fVar54,fVar53);
      uStack_7c8 = CONCAT44(uStack_6e8._4_4_,fVar55);
      local_7c0 = local_280._0_8_;
      uStack_7b8 = local_280._8_8_;
      uStack_7b0 = local_280._16_8_;
      uStack_7a8 = local_280._24_8_;
      local_7a0._0_4_ = (float)uVar35;
      local_760 = (float)local_7a0;
      local_7a0._4_4_ = (float)((ulong)uVar35 >> 0x20);
      fStack_75c = local_7a0._4_4_;
      uStack_798._0_4_ = (float)uVar36;
      fStack_758 = (float)uStack_798;
      uStack_798._4_4_ = (float)((ulong)uVar36 >> 0x20);
      fStack_754 = uStack_798._4_4_;
      uStack_790._0_4_ = (float)uVar37;
      fStack_750 = (float)uStack_790;
      uStack_790._4_4_ = (float)((ulong)uVar37 >> 0x20);
      fStack_74c = uStack_790._4_4_;
      uStack_788._0_4_ = (float)uVar38;
      fStack_748 = (float)uStack_788;
      uStack_788._4_4_ = (float)((ulong)uVar38 >> 0x20);
      fStack_744 = uStack_788._4_4_;
      local_780._0_4_ = auVar22._0_4_;
      local_780._4_4_ = auVar22._4_4_;
      uStack_778._0_4_ = auVar22._8_4_;
      uStack_778._4_4_ = auVar22._12_4_;
      uStack_770._0_4_ = auVar21._0_4_;
      uStack_770._4_4_ = auVar21._4_4_;
      uStack_768._0_4_ = auVar21._8_4_;
      local_1a0 = (float)local_7a0 * (float)local_780;
      fStack_19c = local_7a0._4_4_ * local_780._4_4_;
      fStack_198 = (float)uStack_798 * (float)uStack_778;
      fStack_194 = uStack_798._4_4_ * uStack_778._4_4_;
      fStack_190 = (float)uStack_790 * (float)uStack_770;
      fStack_18c = uStack_790._4_4_ * uStack_770._4_4_;
      fStack_188 = (float)uStack_788 * (float)uStack_768;
      local_460 = CONCAT44(fStack_19c + fVar50,local_1a0 + fVar45);
      uStack_458 = CONCAT44(fStack_194 + fVar52,fStack_198 + fVar51);
      uStack_450 = CONCAT44(fStack_18c + fVar54,fStack_190 + fVar53);
      uStack_448 = CONCAT44(uStack_788._4_4_ + uStack_6e8._4_4_,fStack_188 + fVar55);
      local_428 = local_c90;
      *(undefined8 *)local_c90 = local_460;
      *(undefined8 *)(local_c90 + 2) = uStack_458;
      *(undefined8 *)(local_c90 + 4) = uStack_450;
      *(undefined8 *)(local_c90 + 6) = uStack_448;
      local_c90 = local_c90 + 8;
      local_c70 = local_c70 + 8;
      local_c78 = local_c78 + 8;
      local_c80 = local_c80 + 8;
      local_c88 = local_c88 + 8;
      local_820 = local_340._0_8_;
      uStack_818 = local_340._8_8_;
      uStack_810 = local_340._16_8_;
      uStack_808 = local_340._24_8_;
      local_800 = uVar23;
      uStack_7f8 = uVar24;
      uStack_7f0 = uVar25;
      uStack_7e8 = uVar26;
      local_7a0 = uVar35;
      uStack_798 = uVar36;
      uStack_790 = uVar37;
      uStack_788 = uVar38;
      local_780 = local_280._0_8_;
      uStack_778 = local_280._8_8_;
      uStack_770 = local_280._16_8_;
      uStack_768 = local_280._24_8_;
      local_700 = uVar31;
      uStack_6f8 = uVar32;
      uStack_6f0 = uVar33;
      uStack_6e8 = uVar34;
      local_6e0 = local_2c0._0_8_;
      uStack_6d8 = local_2c0._8_8_;
      uStack_6d0 = local_2c0._16_8_;
      uStack_6c8 = local_2c0._24_8_;
      local_660 = uVar27;
      uStack_658 = uVar28;
      uStack_650 = uVar29;
      uStack_648 = uVar30;
      local_640 = local_300._0_8_;
      uStack_638 = local_300._8_8_;
      uStack_630 = local_300._16_8_;
      uStack_628 = local_300._24_8_;
      fStack_204 = fStack_604;
      local_200 = local_740;
      uStack_1f8 = uStack_738;
      uStack_1f0 = uStack_730;
      uStack_1e8 = uStack_728;
      fStack_1c4 = fStack_6a4;
      local_1c0 = local_7e0;
      uStack_1b8 = uStack_7d8;
      uStack_1b0 = uStack_7d0;
      uStack_1a8 = uStack_7c8;
      fStack_184 = fStack_744;
    }
    for (; local_c94 + 3 < local_954; local_c94 = local_c94 + 4) {
      local_38 = local_c70;
      uVar23 = *(undefined8 *)local_c70;
      uVar24 = *(undefined8 *)(local_c70 + 2);
      local_40 = local_c78;
      local_490 = *(undefined8 *)local_c78;
      uStack_488 = *(undefined8 *)(local_c78 + 2);
      local_48 = local_c80;
      local_4e0 = *(undefined8 *)local_c80;
      uStack_4d8 = *(undefined8 *)(local_c80 + 2);
      local_50 = local_c88;
      local_530 = *(undefined8 *)local_c88;
      uStack_528 = *(undefined8 *)(local_c88 + 2);
      local_560._0_4_ = (float)uVar23;
      local_560._4_4_ = (float)((ulong)uVar23 >> 0x20);
      uStack_558._0_4_ = (float)uVar24;
      uStack_558._4_4_ = (float)((ulong)uVar24 >> 0x20);
      local_e50 = CONCAT44(local_560._4_4_ * local_824,(float)local_560 * local_824);
      uStack_e48 = CONCAT44(uStack_558._4_4_ * local_824,(float)uStack_558 * local_824);
      local_4b0 = local_e50;
      uStack_4a8 = uStack_e48;
      local_470._0_4_ = (float)local_490;
      local_470._4_4_ = (float)((ulong)local_490 >> 0x20);
      uStack_468._0_4_ = (float)uStack_488;
      uStack_468._4_4_ = (float)((ulong)uStack_488 >> 0x20);
      local_160 = (float)local_470 * local_828;
      fStack_15c = local_470._4_4_ * local_828;
      fStack_158 = (float)uStack_468 * local_828;
      fStack_154 = uStack_468._4_4_ * local_828;
      local_170 = local_e50;
      uStack_168 = uStack_e48;
      fVar45 = local_160 + (float)local_560 * local_824;
      fVar50 = fStack_15c + local_560._4_4_ * local_824;
      fVar51 = fStack_158 + (float)uStack_558 * local_824;
      fVar52 = fStack_154 + uStack_558._4_4_ * local_824;
      local_500 = CONCAT44(fVar50,fVar45);
      uStack_4f8 = CONCAT44(fVar52,fVar51);
      local_4c0._0_4_ = (float)local_4e0;
      local_4c0._4_4_ = (float)((ulong)local_4e0 >> 0x20);
      uStack_4b8._0_4_ = (float)uStack_4d8;
      uStack_4b8._4_4_ = (float)((ulong)uStack_4d8 >> 0x20);
      local_140 = (float)local_4c0 * local_82c;
      fStack_13c = local_4c0._4_4_ * local_82c;
      fStack_138 = (float)uStack_4b8 * local_82c;
      fStack_134 = uStack_4b8._4_4_ * local_82c;
      fVar45 = local_140 + fVar45;
      fVar50 = fStack_13c + fVar50;
      fVar51 = fStack_138 + fVar51;
      fVar52 = fStack_134 + fVar52;
      local_550 = CONCAT44(fVar50,fVar45);
      uStack_548 = CONCAT44(fVar52,fVar51);
      local_510._0_4_ = (float)local_530;
      local_510._4_4_ = (float)((ulong)local_530 >> 0x20);
      uStack_508._0_4_ = (float)uStack_528;
      uStack_508._4_4_ = (float)((ulong)uStack_528 >> 0x20);
      local_120 = (float)local_510 * local_830;
      fStack_11c = local_510._4_4_ * local_830;
      fStack_118 = (float)uStack_508 * local_830;
      fStack_114 = uStack_508._4_4_ * local_830;
      local_360 = CONCAT44(fStack_11c + fVar50,local_120 + fVar45);
      uStack_358 = CONCAT44(fStack_114 + fVar52,fStack_118 + fVar51);
      local_348 = local_c90;
      *(undefined8 *)local_c90 = local_360;
      *(undefined8 *)(local_c90 + 2) = uStack_358;
      local_c90 = local_c90 + 4;
      local_c70 = local_c70 + 4;
      local_c78 = local_c78 + 4;
      local_c80 = local_c80 + 4;
      local_c88 = local_c88 + 4;
      local_570 = CONCAT44(local_824,local_824);
      uStack_568 = CONCAT44(local_824,local_824);
      local_560 = uVar23;
      uStack_558 = uVar24;
      local_540 = CONCAT44(local_830,local_830);
      uStack_538 = CONCAT44(local_830,local_830);
      local_520 = CONCAT44(local_830,local_830);
      uStack_518 = CONCAT44(local_830,local_830);
      local_510 = local_530;
      uStack_508 = uStack_528;
      local_4f0 = CONCAT44(local_82c,local_82c);
      uStack_4e8 = CONCAT44(local_82c,local_82c);
      local_4d0 = CONCAT44(local_82c,local_82c);
      uStack_4c8 = CONCAT44(local_82c,local_82c);
      local_4c0 = local_4e0;
      uStack_4b8 = uStack_4d8;
      local_4a0 = CONCAT44(local_828,local_828);
      uStack_498 = CONCAT44(local_828,local_828);
      local_480 = CONCAT44(local_828,local_828);
      uStack_478 = CONCAT44(local_828,local_828);
      local_470 = local_490;
      uStack_468 = uStack_488;
      local_150 = local_500;
      uStack_148 = uStack_4f8;
      local_130 = local_550;
      uStack_128 = uStack_548;
    }
    for (; local_c94 < local_954; local_c94 = local_c94 + 1) {
      *local_c90 = *local_c70 * local_824 + *local_c78 * local_828 + *local_c80 * local_82c +
                   *local_c88 * local_830;
      local_c90 = local_c90 + 1;
      local_c88 = local_c88 + 1;
      local_c80 = local_c80 + 1;
      local_c78 = local_c78 + 1;
      local_c70 = local_c70 + 1;
    }
    local_948 = local_948 + 4;
    local_aac = iVar1;
    local_5f0 = local_830;
    fStack_5ec = local_830;
    fStack_5e8 = local_830;
    fStack_5e4 = local_830;
    local_5d4 = local_830;
    local_5d0 = local_82c;
    fStack_5cc = local_82c;
    fStack_5c8 = local_82c;
    fStack_5c4 = local_82c;
    local_5b4 = local_82c;
    local_5b0 = local_828;
    fStack_5ac = local_828;
    fStack_5a8 = local_828;
    fStack_5a4 = local_828;
    local_594 = local_828;
    local_590 = local_824;
    fStack_58c = local_824;
    fStack_588 = local_824;
    fStack_584 = local_824;
    local_574 = local_824;
    local_340 = auVar46;
    local_320 = local_824;
    local_31c = local_824;
    local_318 = local_824;
    local_314 = local_824;
    local_310 = local_824;
    local_30c = local_824;
    local_308 = local_824;
    local_304 = local_824;
    local_300 = auVar47;
    local_2e0 = local_828;
    local_2dc = local_828;
    local_2d8 = local_828;
    local_2d4 = local_828;
    local_2d0 = local_828;
    local_2cc = local_828;
    local_2c8 = local_828;
    local_2c4 = local_828;
    local_2c0 = auVar48;
    local_2a0 = local_82c;
    local_29c = local_82c;
    local_298 = local_82c;
    local_294 = local_82c;
    local_290 = local_82c;
    local_28c = local_82c;
    local_288 = local_82c;
    local_284 = local_82c;
    local_280 = auVar49;
    local_260 = local_830;
    local_25c = local_830;
    local_258 = local_830;
    local_254 = local_830;
    local_250 = local_830;
    local_24c = local_830;
    local_248 = local_830;
    local_244 = local_830;
  }
  local_920 = &local_a88;
  local_3a8 = local_920;
  if (local_a80 != (int *)0x0) {
    local_3ac = 0xffffffff;
    LOCK();
    local_3b0 = *local_a80;
    *local_a80 = *local_a80 + -1;
    UNLOCK();
    if (local_3b0 == 1) {
      if (local_a68 == (long *)0x0) {
        local_3a0 = local_a88;
        if (local_a88 != (float *)0x0) {
          free(local_a88);
        }
      }
      else {
        (**(code **)(*local_a68 + 0x18))(local_a68,local_a88);
      }
    }
  }
  local_a88 = (float *)0x0;
  local_a78 = 0;
  local_a70 = 0;
  local_a60 = 0;
  local_a5c = 0;
  local_a58 = 0;
  local_a54 = 0;
  local_a50 = 0;
  local_a48 = 0;
  local_a80 = (int *)0x0;
  local_910 = &local_a40;
  local_3c8 = local_910;
  if (local_a38 != (int *)0x0) {
    local_3cc = 0xffffffff;
    LOCK();
    local_3d0 = *local_a38;
    *local_a38 = *local_a38 + -1;
    UNLOCK();
    if (local_3d0 == 1) {
      if (local_a20 == (long *)0x0) {
        local_390 = local_a40;
        if (local_a40 != (float *)0x0) {
          free(local_a40);
        }
      }
      else {
        (**(code **)(*local_a20 + 0x18))(local_a20,local_a40);
      }
    }
  }
  local_a40 = (float *)0x0;
  local_a30 = 0;
  local_a28 = 0;
  local_a18 = 0;
  local_a14 = 0;
  local_a10 = 0;
  local_a0c = 0;
  local_a08 = 0;
  local_a00 = 0;
  local_a38 = (int *)0x0;
  local_900 = &local_9e8;
  local_3e8 = local_900;
  if (local_9e0 != (int *)0x0) {
    local_3ec = 0xffffffff;
    LOCK();
    local_3f0 = *local_9e0;
    *local_9e0 = *local_9e0 + -1;
    UNLOCK();
    if (local_3f0 == 1) {
      if (local_9c8 == (long *)0x0) {
        local_380 = local_9e8;
        if (local_9e8 != (float *)0x0) {
          free(local_9e8);
        }
      }
      else {
        (**(code **)(*local_9c8 + 0x18))(local_9c8,local_9e8);
      }
    }
  }
  local_9e8 = (float *)0x0;
  local_9d8 = 0;
  local_9d0 = 0;
  local_9c0 = 0;
  local_9bc = 0;
  local_9b8 = 0;
  local_9b4 = 0;
  local_9b0 = 0;
  local_9a8 = 0;
  local_9e0 = (int *)0x0;
  local_8f0 = &local_9a0;
  if (local_998 != (int *)0x0) {
    local_40c = 0xffffffff;
    LOCK();
    local_410 = *local_998;
    *local_998 = *local_998 + -1;
    UNLOCK();
    if (local_410 == 1) {
      local_408 = local_8f0;
      if (local_980 == (long *)0x0) {
        local_370 = local_9a0;
        if (local_9a0 != (float *)0x0) {
          free(local_9a0);
        }
      }
      else {
        (**(code **)(*local_980 + 0x18))(local_980,local_9a0);
      }
    }
  }
  return;
}

Assistant:

static void resize_bicubic_image(const Mat& src, Mat& dst, float* alpha, int* xofs, float* beta, int* yofs)
{
    int w = dst.w;
    int h = dst.h;

    // loop body
    Mat rowsbuf0(w);
    Mat rowsbuf1(w);
    Mat rowsbuf2(w);
    Mat rowsbuf3(w);
    float* rows0 = rowsbuf0;
    float* rows1 = rowsbuf1;
    float* rows2 = rowsbuf2;
    float* rows3 = rowsbuf3;

    int prev_sy1 = -3;

    for (int dy = 0; dy < h; dy++)
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            float* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows2;
            rows2 = rows3;
            rows3 = rows0_old;
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx];
                const float* S3p = S3 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                float a2 = alphap[2];
                float a3 = alphap[3];
                rows3p[dx] = S3p[-1] * a0 + S3p[0] * a1 + S3p[1] * a2 + S3p[2] * a3;

                alphap += 4;
            }
        }
        else if (sy == prev_sy1 + 2)
        {
            // hresize two rows
            float* rows0_old = rows0;
            float* rows1_old = rows1;
            rows0 = rows2;
            rows1 = rows3;
            rows2 = rows0_old;
            rows3 = rows1_old;
            const float* S2 = src.row(sy + 1);
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx];
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                float a2 = alphap[2];
                float a3 = alphap[3];
                rows2p[dx] = S2p[-1] * a0 + S2p[0] * a1 + S2p[1] * a2 + S2p[2] * a3;
                rows3p[dx] = S3p[-1] * a0 + S3p[0] * a1 + S3p[1] * a2 + S3p[2] * a3;

                alphap += 4;
            }
        }
        else if (sy == prev_sy1 + 3)
        {
            // hresize three rows
            float* rows0_old = rows0;
            float* rows1_old = rows1;
            float* rows2_old = rows2;
            rows0 = rows3;
            rows1 = rows0_old;
            rows2 = rows1_old;
            rows3 = rows2_old;
            const float* S1 = src.row(sy);
            const float* S2 = src.row(sy + 1);
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows1p = rows1;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx];
                const float* S1p = S1 + sx;
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                float a2 = alphap[2];
                float a3 = alphap[3];
                rows1p[dx] = S1p[-1] * a0 + S1p[0] * a1 + S1p[1] * a2 + S1p[2] * a3;
                rows2p[dx] = S2p[-1] * a0 + S2p[0] * a1 + S2p[1] * a2 + S2p[2] * a3;
                rows3p[dx] = S3p[-1] * a0 + S3p[0] * a1 + S3p[1] * a2 + S3p[2] * a3;

                alphap += 4;
            }
        }
        else
        {
            // hresize four rows
            const float* S0 = src.row(sy - 1);
            const float* S1 = src.row(sy);
            const float* S2 = src.row(sy + 1);
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows0p = rows0;
            float* rows1p = rows1;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx];
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                float a2 = alphap[2];
                float a3 = alphap[3];
                rows0p[dx] = S0p[-1] * a0 + S0p[0] * a1 + S0p[1] * a2 + S0p[2] * a3;
                rows1p[dx] = S1p[-1] * a0 + S1p[0] * a1 + S1p[1] * a2 + S1p[2] * a3;
                rows2p[dx] = S2p[-1] * a0 + S2p[0] * a1 + S2p[1] * a2 + S2p[2] * a3;
                rows3p[dx] = S3p[-1] * a0 + S3p[0] * a1 + S3p[1] * a2 + S3p[2] * a3;

                alphap += 4;
            }
        }

        prev_sy1 = sy;

        // vresize
        float b0 = beta[0];
        float b1 = beta[1];
        float b2 = beta[2];
        float b3 = beta[3];

        float* rows0p = rows0;
        float* rows1p = rows1;
        float* rows2p = rows2;
        float* rows3p = rows3;
        float* Dp = dst.row(dy);

        int dx = 0;
#if __SSE2__
#if __AVX__
        __m256 _b0_256 = _mm256_set1_ps(b0);
        __m256 _b1_256 = _mm256_set1_ps(b1);
        __m256 _b2_256 = _mm256_set1_ps(b2);
        __m256 _b3_256 = _mm256_set1_ps(b3);
        for (; dx + 7 < w; dx += 8)
        {
            __m256 _rows0 = _mm256_loadu_ps(rows0p);
            __m256 _rows1 = _mm256_loadu_ps(rows1p);
            __m256 _rows2 = _mm256_loadu_ps(rows2p);
            __m256 _rows3 = _mm256_loadu_ps(rows3p);
            __m256 _D = _mm256_mul_ps(_rows0, _b0_256);
            _D = _mm256_comp_fmadd_ps(_rows1, _b1_256, _D);
            _D = _mm256_comp_fmadd_ps(_rows2, _b2_256, _D);
            _D = _mm256_comp_fmadd_ps(_rows3, _b3_256, _D);
            _mm256_storeu_ps(Dp, _D);

            Dp += 8;
            rows0p += 8;
            rows1p += 8;
            rows2p += 8;
            rows3p += 8;
        }
#endif // __AVX__
        __m128 _b0_128 = _mm_set1_ps(b0);
        __m128 _b1_128 = _mm_set1_ps(b1);
        __m128 _b2_128 = _mm_set1_ps(b2);
        __m128 _b3_128 = _mm_set1_ps(b3);
        for (; dx + 3 < w; dx += 4)
        {
            __m128 _rows0 = _mm_loadu_ps(rows0p);
            __m128 _rows1 = _mm_loadu_ps(rows1p);
            __m128 _rows2 = _mm_loadu_ps(rows2p);
            __m128 _rows3 = _mm_loadu_ps(rows3p);
            __m128 _D = _mm_mul_ps(_rows0, _b0_128);
            _D = _mm_comp_fmadd_ps(_rows1, _b1_128, _D);
            _D = _mm_comp_fmadd_ps(_rows2, _b2_128, _D);
            _D = _mm_comp_fmadd_ps(_rows3, _b3_128, _D);
            _mm_storeu_ps(Dp, _D);

            Dp += 4;
            rows0p += 4;
            rows1p += 4;
            rows2p += 4;
            rows3p += 4;
        }
#endif // __SSE2__
        for (; dx < w; dx++)
        {
            *Dp++ = *rows0p++ * b0 + *rows1p++ * b1 + *rows2p++ * b2 + *rows3p++ * b3;
        }

        beta += 4;
    }
}